

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_encoder.hpp
# Opt level: O0

bool __thiscall
jsoncons::
basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
::visit_int64(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
              *this,int64_t value,semantic_tag param_3,ser_context *param_4,error_code *param_5)

{
  bool bVar1;
  reference pvVar2;
  basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *pbVar3;
  type_conflict2 tVar4;
  long in_RDI;
  size_t length;
  string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *in_stack_00000128;
  long in_stack_00000130;
  basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffffc0;
  basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
  *in_stack_ffffffffffffffd0;
  
  bVar1 = std::
          vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
          ::empty((vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
                   *)in_stack_ffffffffffffffd0);
  if (!bVar1) {
    pvVar2 = std::
             vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffffc0);
    bVar1 = encoding_context::is_array(pvVar2);
    if (bVar1) {
      begin_scalar_value(in_stack_ffffffffffffffd0);
    }
    pvVar2 = std::
             vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
             ::back((vector<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context,_std::allocator<jsoncons::basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>::encoding_context>_>
                     *)in_stack_ffffffffffffffc0);
    bVar1 = encoding_context::is_multi_line(pvVar2);
    if (!bVar1) {
      in_stack_ffffffffffffffc0 =
           *(basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
             **)(in_RDI + 0x178);
      pbVar3 = (basic_json_encoder<char,_jsoncons::string_sink<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<char>_>
                *)basic_json_encode_options<char>::line_length_limit
                            ((basic_json_encode_options<char> *)(in_RDI + 0x10));
      if (pbVar3 <= in_stack_ffffffffffffffc0) {
        break_line(in_stack_ffffffffffffffc0);
      }
    }
  }
  tVar4 = detail::from_integer<long,jsoncons::string_sink<std::__cxx11::string>>
                    (in_stack_00000130,in_stack_00000128);
  *(type_conflict2 *)(in_RDI + 0x178) = tVar4 + *(long *)(in_RDI + 0x178);
  end_value(in_stack_ffffffffffffffc0);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_int64(int64_t value, 
                            semantic_tag,
                            const ser_context&,
                            std::error_code&) final
        {
            if (!stack_.empty()) 
            {
                if (stack_.back().is_array())
                {
                    begin_scalar_value();
                }
                if (!stack_.back().is_multi_line() && column_ >= options_.line_length_limit())
                {
                    break_line();
                }
            }
            std::size_t length = jsoncons::detail::from_integer(value, sink_);
            column_ += length;
            end_value();
            JSONCONS_VISITOR_RETURN;
        }